

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O0

TestCaseGroup * vkt::FragmentOperations::createEarlyFragmentTests(TestContext *testCtx)

{
  undefined8 testCtx_00;
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *this;
  EarlyFragmentTest *this_00;
  string local_68;
  int local_48;
  undefined1 local_41;
  int i;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  anon_struct_40_2_b44cab0d *local_38;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"early_fragment","early fragment test cases");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  if (createEarlyFragmentTests(tcu::TestContext&)::cases == '\0') {
    iVar1 = __cxa_guard_acquire(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    if (iVar1 != 0) {
      local_41 = 1;
      local_38 = createEarlyFragmentTests::cases;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)createEarlyFragmentTests::cases,"no_early_fragment_tests_depth",&local_39
                );
      createEarlyFragmentTests::cases[0].flags = 9;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f6fb8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 1),"no_early_fragment_tests_stencil",
                 &local_3a);
      createEarlyFragmentTests::cases[1].flags = 10;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f6fe0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 2),"early_fragment_tests_depth",
                 &local_3b);
      createEarlyFragmentTests::cases[2].flags = 1;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f7008;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 3),"early_fragment_tests_stencil",
                 &local_3c);
      createEarlyFragmentTests::cases[3].flags = 2;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f7030;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 4),
                 "no_early_fragment_tests_depth_no_attachment",(allocator<char> *)((long)&i + 3));
      createEarlyFragmentTests::cases[4].flags = 0xd;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f7058;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 5),
                 "no_early_fragment_tests_stencil_no_attachment",(allocator<char> *)((long)&i + 2));
      createEarlyFragmentTests::cases[5].flags = 0xe;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f7080;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 6),
                 "early_fragment_tests_depth_no_attachment",(allocator<char> *)((long)&i + 1));
      createEarlyFragmentTests::cases[6].flags = 5;
      local_38 = (anon_struct_40_2_b44cab0d *)0x16f70a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(createEarlyFragmentTests::cases + 7),
                 "early_fragment_tests_stencil_no_attachment",(allocator<char> *)&i);
      createEarlyFragmentTests::cases[7].flags = 6;
      local_41 = 0;
      std::allocator<char>::~allocator((allocator<char> *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
      std::allocator<char>::~allocator(&local_3c);
      std::allocator<char>::~allocator(&local_3b);
      std::allocator<char>::~allocator(&local_3a);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    }
  }
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
    this_00 = (EarlyFragmentTest *)operator_new(0x78);
    testCtx_00 = testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._8_8_;
    std::__cxx11::string::string
              ((string *)&local_68,(string *)(createEarlyFragmentTests::cases + local_48));
    anon_unknown_1::EarlyFragmentTest::EarlyFragmentTest
              (this_00,(TestContext *)testCtx_00,&local_68,
               createEarlyFragmentTests::cases[local_48].flags);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_68);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createEarlyFragmentTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "early_fragment", "early fragment test cases"));

	static const struct
	{
		std::string caseName;
		deUint32	flags;
	} cases[] =
	{
		{ "no_early_fragment_tests_depth",					FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "no_early_fragment_tests_stencil",				FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "early_fragment_tests_depth",						FLAG_TEST_DEPTH																			},
		{ "early_fragment_tests_stencil",					FLAG_TEST_STENCIL																		},
		{ "no_early_fragment_tests_depth_no_attachment",	FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "no_early_fragment_tests_stencil_no_attachment",	FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "early_fragment_tests_depth_no_attachment",		FLAG_TEST_DEPTH   |										 FLAG_DONT_USE_TEST_ATTACHMENT  },
		{ "early_fragment_tests_stencil_no_attachment",		FLAG_TEST_STENCIL |										 FLAG_DONT_USE_TEST_ATTACHMENT	},
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(cases); ++i)
		testGroup->addChild(new EarlyFragmentTest(testCtx, cases[i].caseName, cases[i].flags));

	return testGroup.release();
}